

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concat_tests.cpp
# Opt level: O2

void ConcatTestCheckCount(char *name,int num)

{
  TestSuite *val;
  int *in_R9;
  int num_local;
  AssertionResult iutest_ar;
  iuCodeMessage local_1c8;
  Fixed local_198;
  
  num_local = num;
  val = iuutil::FindTestSuite(name);
  iutest::internal::NullHelper<false>::CompareNe<iutest::TestSuite>(&iutest_ar,"(p)",val);
  if (iutest_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/concat_tests.cpp"
               ,0x43,iutest_ar.m_message._M_dataplus._M_p);
    local_1c8._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c8,&local_198);
  }
  else {
    std::__cxx11::string::~string((string *)&iutest_ar);
    local_198.super_Message.m_stream.super_iu_stringstream._0_4_ =
         SUB84((ulong)((long)(val->m_testinfos).
                             super__Vector_base<iutest::TestInfo_*,_std::allocator<iutest::TestInfo_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(val->m_testinfos).
                            super__Vector_base<iutest::TestInfo_*,_std::allocator<iutest::TestInfo_*>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 3,0);
    iutest::internal::CmpHelperEQ<int,int>
              (&iutest_ar,(internal *)"num","p->total_test_count()",(char *)&num_local,
               (int *)&local_198,in_R9);
    if (iutest_ar.m_result != false) goto LAB_00179a19;
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/concat_tests.cpp"
               ,0x44,iutest_ar.m_message._M_dataplus._M_p);
    local_1c8._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c8,&local_198);
  }
  std::__cxx11::string::~string((string *)&local_1c8);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream
            ((iu_global_format_stringstream *)&local_198);
LAB_00179a19:
  std::__cxx11::string::~string((string *)&iutest_ar);
  return;
}

Assistant:

void ConcatTestCheckCount(const char* name, int num)
{
    const ::iutest::TestSuite* p = ::iuutil::FindTestSuite(name);
    IUTEST_ASSERT_NOTNULL(p);
    IUTEST_ASSERT_EQ(num, p->total_test_count());
}